

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPartHelper.cpp
# Opt level: O2

void (anonymous_namespace)::print<Imf_2_5::MultiViewChannelName*>
               (MultiViewChannelName **begin,MultiViewChannelName **end)

{
  ostream *poVar1;
  MultiViewChannelName *pMVar2;
  MultiViewChannelName *pMVar3;
  int iVar4;
  int iVar5;
  
  pMVar2 = *end;
  iVar5 = 1;
  for (pMVar3 = *begin; pMVar3 != pMVar2; pMVar3 = pMVar3 + 1) {
    if (iVar5 < pMVar3->part_number) {
      iVar5 = pMVar3->part_number;
    }
  }
  iVar4 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (; iVar4 != iVar5; iVar4 = iVar4 + 1) {
    for (pMVar3 = *begin; pMVar3 != pMVar2; pMVar3 = pMVar3 + 1) {
      if (pMVar3->part_number == iVar4) {
        poVar1 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
        poVar1 = std::operator<<(poVar1,' ');
        poVar1 = std::operator<<(poVar1,(string *)&pMVar3->name);
        poVar1 = std::operator<<(poVar1," in ");
        poVar1 = std::operator<<(poVar1,(string *)&pMVar3->view);
        poVar1 = std::operator<<(poVar1,' ');
        poVar1 = std::operator<<(poVar1,' ');
        poVar1 = std::operator<<(poVar1,(string *)&pMVar3->internal_name);
        std::operator<<(poVar1,"\n");
        pMVar2 = *end;
      }
    }
  }
  return;
}

Assistant:

void
print(const T & begin,const T & end)
{
    int parts=1;
    for(T i=begin;i!=end;i++)
    {
        parts=max(i->part_number,parts);
    }

    for(int p=0;p<parts;p++)
    {
        for(T i=begin;i!=end;i++)
        {
            if(i->part_number==p)
            {
                cout << i->part_number << ' ' << i->name << " in " << i->view
                     << ' ' << ' ' << i->internal_name << "\n";
            }
        }
    }
}